

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O0

int flatbuffers::Vector<keyfield::sample::Bar_const*,unsigned_int>::
    KeyCompare<flatbuffers::Array<float,(unsigned_short)3>*>(void *ap,void *bp)

{
  int iVar1;
  return_type this;
  return_type table;
  uint8_t *data;
  Array<float,_(unsigned_short)3> **key;
  void *bp_local;
  void *ap_local;
  
  this = IndirectHelper<const_keyfield::sample::Bar_*>::Read((uint8_t *)bp,0);
  iVar1 = keyfield::sample::Bar::KeyCompareWithValue(this,*ap);
  return -iVar1;
}

Assistant:

static int KeyCompare(const void *ap, const void *bp) {
    const K *key = reinterpret_cast<const K *>(ap);
    const uint8_t *data = reinterpret_cast<const uint8_t *>(bp);
    auto table = IndirectHelper<T>::Read(data, 0);

    // std::bsearch compares with the operands transposed, so we negate the
    // result here.
    return -table->KeyCompareWithValue(*key);
  }